

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *node)

{
  _Head_base<0UL,_verilogAST::Module_*,_false> _Var1;
  long lVar2;
  long *in_RDX;
  _Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  _Var3;
  __index_type *p_Var4;
  long *plVar5;
  _Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  _Var6;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  new_body;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  _Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_e0;
  _Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_d8;
  undefined8 local_d0;
  long *local_c8;
  Node local_c0;
  long *local_b8;
  unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *local_b0;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  local_a8;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  local_88;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_68;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *local_58;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_50;
  _Head_base<0UL,_verilogAST::Module_*,_false> local_40;
  undefined1 *local_38;
  
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *in_RDX;
  _Var6 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
            *)(lVar2 + 0x28);
  _Var3 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
            *)(lVar2 + 0x30);
  local_b8 = in_RDX;
  local_b0 = node;
  local_40._M_head_impl = (Module *)this;
  if (_Var6 == _Var3) {
    local_88.
    super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    do {
      local_c0._vptr_Node = *(_func_int ***)_Var6;
      *(undefined8 *)_Var6 = 0;
      (**(code **)&(local_b0->_M_t).
                   super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                   .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[2].body.
                   super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                   ._M_impl)(&local_e0,local_b0,&local_c0);
      std::
      vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
      ::
      emplace_back<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>
                ((vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
                  *)&local_88,
                 (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                  *)&local_e0._M_first);
      if (local_e0 !=
          (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
           )0x0) {
        (**(code **)(*(long *)local_e0 + 0x10))();
      }
      local_e0 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  )0x0;
      if (local_c0._vptr_Node != (_func_int **)0x0) {
        (**(code **)(*local_c0._vptr_Node + 0x10))();
      }
      local_c0._vptr_Node = (_func_int **)0x0;
      _Var6 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
               )((long)_Var6 + 8);
    } while (_Var6 != _Var3);
    lVar2 = *local_b8;
    _Var6 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
              *)(lVar2 + 0x28);
    _Var3 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
              *)(lVar2 + 0x30);
  }
  plVar5 = local_b8;
  local_d0 = *(undefined8 *)(lVar2 + 0x38);
  *(undefined4 *)(lVar2 + 0x28) =
       local_88.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)(lVar2 + 0x2c) =
       local_88.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)(lVar2 + 0x30) =
       local_88.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)(lVar2 + 0x34) =
       local_88.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  *(pointer *)(lVar2 + 0x38) =
       local_88.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = _Var6;
  local_d8 = _Var3;
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
             *)&local_e0._M_first);
  lVar2 = *plVar5;
  p_Var4 = *(__index_type **)(lVar2 + 0x58);
  local_38 = *(undefined1 **)(lVar2 + 0x60);
  if (p_Var4 != local_38) {
    do {
      local_50.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = p_Var4[8];
      local_a8.
      super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_50;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&&>
        ::_S_vtable._M_arr
        [local_50.
         super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         ._M_index]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_a8,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)p_Var4);
      (*(code *)(local_b0->_M_t).
                super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>.
                _M_t.
                super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[1].name.
                _M_string_length)(&local_e0,local_b0,&local_50);
      local_a8.
      super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr[(ulong)local_d8 & 0xff]._M_data)
                ((anon_class_8_1_8991fb9c_conflict1 *)&local_a8,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_e0);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr[(ulong)local_d8 & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_a8,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_e0);
      local_d8._M_first._M_storage._M_storage[0] = 0xff;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr
        [local_50.
         super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_a8,&local_50);
      local_50.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = 0xff;
      local_c8 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                               *)(p_Var4 + 0x10))->
                            super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                            ).
                            super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            ._M_u;
      (((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         *)(p_Var4 + 0x10))->
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      ).
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_u = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
               )0x0;
      (**(code **)(local_b0->_M_t).
                  super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                  .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl)
                (&local_e0,local_b0,&local_c8);
      _Var6 = local_e0;
      local_e0 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  )0x0;
      plVar5 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                             *)(p_Var4 + 0x10))->
                          super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                          ).
                          super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          ._M_u;
      *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
        *)(p_Var4 + 0x10) = _Var6;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))();
        if (local_e0 !=
            (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
             )0x0) {
          (**(code **)(*(long *)local_e0 + 0x10))();
        }
      }
      local_e0 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  )0x0;
      if (local_c8 != (long *)0x0) {
        (**(code **)(*local_c8 + 0x10))();
      }
      local_c8 = (long *)0x0;
      p_Var4 = p_Var4 + 0x18;
    } while (p_Var4 != local_38);
    lVar2 = *local_b8;
  }
  local_a8.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var6 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
            *)(lVar2 + 0x40);
  _Var3 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
            *)(lVar2 + 0x48);
  if (_Var6 == _Var3) {
    local_a8.
    super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.
    super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_a8.
    super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    local_a8.
    super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_a8.
    super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    plVar5 = local_b8;
  }
  else {
    do {
      local_68.
      super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      ._M_index = *(__index_type *)((long)_Var6 + 8);
      local_58 = &local_68;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&&>
        ::_S_vtable._M_arr
        [local_68.
         super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         ._M_index]._M_data)
                ((anon_class_8_1_a78179b7_conflict2 *)&local_58,
                 (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)_Var6);
      local_58 = (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)local_b0;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST/transformer.hpp:13:9)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
        ::_S_vtable._M_arr
        [local_68.
         super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         ._M_index]._M_data)
                ((variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)&local_e0,(anon_class_8_1_8991fb9c_conflict4 *)&local_58,&local_68);
      std::
      vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>,std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>>
      ::
      emplace_back<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>
                ((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>,std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>>
                  *)&local_a8,
                 (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)&local_e0._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
        ::_S_vtable._M_arr[(ulong)local_d8 & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_58,
                 (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)&local_e0);
      local_d8._M_first._M_storage._M_storage[0] = 0xff;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
        ::_S_vtable._M_arr
        [local_68.
         super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_58,&local_68);
      local_68.
      super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      ._M_index = 0xff;
      _Var6 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
               )((long)_Var6 + 0x10);
    } while (_Var6 != _Var3);
    lVar2 = *local_b8;
    _Var6 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
              *)(lVar2 + 0x40);
    _Var3 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
              *)(lVar2 + 0x48);
    plVar5 = local_b8;
  }
  local_d0 = *(undefined8 *)(lVar2 + 0x50);
  *(undefined4 *)(lVar2 + 0x40) =
       local_a8.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)(lVar2 + 0x44) =
       local_a8.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)(lVar2 + 0x48) =
       local_a8.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)(lVar2 + 0x4c) =
       local_a8.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  *(pointer *)(lVar2 + 0x50) =
       local_a8.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = _Var6;
  local_d8 = _Var3;
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::~vector((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
             *)&local_e0._M_first);
  _Var1._M_head_impl = local_40._M_head_impl;
  *(long *)local_40._M_head_impl = *plVar5;
  *plVar5 = 0;
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector(&local_88);
  return (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         _Var1._M_head_impl;
}

Assistant:

std::unique_ptr<Module> Transformer::visit(std::unique_ptr<Module> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  std::vector<std::variant<std::unique_ptr<StructuralStatement>,
                           std::unique_ptr<Declaration>>>
      new_body;
  for (auto&& item : node->body) {
    new_body.push_back(this->visit(std::move(item)));
  }
  node->body = std::move(new_body);
  return node;
}